

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O1

version_type __thiscall pstore::uuid::version(uuid *this)

{
  uint uVar1;
  version_type vVar2;
  
  uVar1 = (this->data_)._M_elems[6] - 0x10;
  vVar2 = unknown;
  if (uVar1 < 0x50) {
    vVar2 = (uVar1 >> 4) + time_based;
  }
  return vVar2;
}

Assistant:

auto uuid::version () const noexcept -> version_type {
        switch (data_[version_octet] & 0xF0) {
        case 0x10: return version_type::time_based;
        case 0x20: return version_type::dce_security;
        case 0x30: return version_type::name_based_md5;
        case 0x40: return version_type::random_number_based;
        case 0x50: return version_type::name_based_sha1;
        default: return version_type::unknown;
        }
    }